

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_watch_file(void)

{
  int iVar1;
  int extraout_EAX;
  uv_timer_t *puVar2;
  int iVar3;
  int extraout_EDX;
  uv_fs_event_t *puVar4;
  uv_fs_event_t *puVar5;
  uv_timer_t *puVar6;
  uv_fs_event_t *puVar7;
  uv_fs_event_t auStack_1e0 [3];
  uv_timer_t *puStack_28;
  code *pcStack_20;
  
  pcStack_20 = (code *)0x1509fa;
  puVar2 = (uv_timer_t *)uv_default_loop();
  pcStack_20 = (code *)0x150a0c;
  remove("watch_dir/file2");
  pcStack_20 = (code *)0x150a1b;
  remove("watch_dir/file1");
  pcStack_20 = (code *)0x150a27;
  remove("watch_dir/");
  pcStack_20 = (code *)0x150a33;
  create_dir("watch_dir");
  pcStack_20 = (code *)0x150a3b;
  create_file("watch_dir/file1");
  pcStack_20 = (code *)0x150a43;
  create_file("watch_dir/file2");
  pcStack_20 = (code *)0x150a52;
  puVar6 = puVar2;
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  if (iVar1 == 0) {
    puVar5 = &fs_event;
    pcStack_20 = (code *)0x150a76;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    puVar6 = (uv_timer_t *)puVar5;
    if (iVar1 != 0) goto LAB_00150b4c;
    pcStack_20 = (code *)0x150a8d;
    puVar6 = puVar2;
    iVar1 = uv_timer_init(puVar2,&timer);
    if (iVar1 != 0) goto LAB_00150b51;
    puVar6 = &timer;
    pcStack_20 = (code *)0x150ab2;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    if (iVar1 != 0) goto LAB_00150b56;
    pcStack_20 = (code *)0x150ac4;
    puVar6 = puVar2;
    uv_run(puVar2,0);
    if (fs_event_cb_called != 1) goto LAB_00150b5b;
    if (timer_cb_called != 2) goto LAB_00150b60;
    if (close_cb_called != 2) goto LAB_00150b65;
    pcStack_20 = (code *)0x150af3;
    remove("watch_dir/file2");
    pcStack_20 = (code *)0x150aff;
    remove("watch_dir/file1");
    pcStack_20 = (code *)0x150b0b;
    remove("watch_dir/");
    pcStack_20 = (code *)0x150b10;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_20 = (code *)0x150b24;
    uv_walk(puVar2,close_walk_cb,0);
    pcStack_20 = (code *)0x150b2e;
    uv_run(puVar2,0);
    pcStack_20 = (code *)0x150b33;
    puVar6 = (uv_timer_t *)uv_default_loop();
    pcStack_20 = (code *)0x150b3b;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_20 = (code *)0x150b4c;
    run_test_fs_event_watch_file_cold_1();
LAB_00150b4c:
    pcStack_20 = (code *)0x150b51;
    run_test_fs_event_watch_file_cold_2();
LAB_00150b51:
    pcStack_20 = (code *)0x150b56;
    run_test_fs_event_watch_file_cold_3();
LAB_00150b56:
    pcStack_20 = (code *)0x150b5b;
    run_test_fs_event_watch_file_cold_4();
LAB_00150b5b:
    pcStack_20 = (code *)0x150b60;
    run_test_fs_event_watch_file_cold_5();
LAB_00150b60:
    pcStack_20 = (code *)0x150b65;
    run_test_fs_event_watch_file_cold_6();
LAB_00150b65:
    pcStack_20 = (code *)0x150b6a;
    run_test_fs_event_watch_file_cold_7();
  }
  pcStack_20 = create_file;
  run_test_fs_event_watch_file_cold_8();
  pcStack_20 = (code *)0x182f1e;
  puVar5 = auStack_1e0;
  puVar4 = auStack_1e0;
  puVar7 = (uv_fs_event_t *)0x0;
  iVar3 = 0x41;
  puStack_28 = puVar2;
  iVar1 = uv_fs_open(0,auStack_1e0,puVar6,0x41,0x180,0);
  if (iVar1 < 0) {
    create_file_cold_1();
  }
  else {
    uv_fs_req_cleanup();
    puVar7 = (uv_fs_event_t *)0x0;
    iVar3 = 0;
    iVar1 = uv_fs_close(0,auStack_1e0,iVar1);
    puVar5 = puVar4;
    if (iVar1 == 0) {
      iVar1 = uv_fs_req_cleanup(auStack_1e0);
      return iVar1;
    }
  }
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar7 == &fs_event) {
    if (iVar3 != 0) goto LAB_00150c2f;
    if (extraout_EDX != 2) goto LAB_00150c34;
    iVar1 = strcmp((char *)puVar5,"file2");
    if (iVar1 == 0) {
      puVar5 = &fs_event;
      iVar1 = uv_fs_event_stop(&fs_event);
      if (iVar1 == 0) {
        iVar1 = uv_close(&fs_event,close_cb);
        return iVar1;
      }
      goto LAB_00150c3e;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_00150c2f:
    fs_event_cb_file_cold_2();
LAB_00150c34:
    puVar5 = puVar7;
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00150c3e:
  fs_event_cb_file_cold_5();
  if (timer_cb_called != 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file2");
    iVar1 = uv_close(puVar5,close_cb);
    return iVar1;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file1");
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_watch_file) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "watch_dir/file2", 0);
  ASSERT(r == 0);
  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);
  r = uv_timer_start(&timer, timer_cb_file, 100, 100);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(fs_event_cb_called == 1);
  ASSERT(timer_cb_called == 2);
  ASSERT(close_cb_called == 2);

  /* Cleanup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY();
  return 0;
}